

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeInteger.c
# Opt level: O0

asn_dec_rval_t
NativeInteger_decode_ber
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **nint_ptr,void *buf_ptr,
          size_t size,int tag_mode)

{
  long lVar1;
  int iVar2;
  long in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  long in_R8;
  uint in_R9D;
  asn_dec_rval_t aVar3;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  asn_struct_ctx_t *in_stack_00000010;
  asn_TYPE_descriptor_t *in_stack_00000018;
  long l;
  anon_union_8_2_87ab0850 unconst_buf;
  INTEGER_t tmp;
  int in_stack_00000040;
  ber_tlv_len_t *in_stack_00000048;
  ber_tlv_len_t length;
  long *native;
  asn_INTEGER_specifics_t *specs;
  asn_dec_rval_t rval;
  unsigned_long *in_stack_ffffffffffffff70;
  INTEGER_t *in_stack_ffffffffffffff78;
  ulong local_58;
  undefined8 *local_50;
  ulong local_10;
  undefined8 in_stack_fffffffffffffff8;
  size_t sVar4;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  lVar1 = in_RSI[0x13];
  local_50 = (undefined8 *)*in_RDX;
  if (local_50 == (undefined8 *)0x0) {
    local_50 = (undefined8 *)calloc(1,8);
    *in_RDX = (long)local_50;
    if (local_50 == (undefined8 *)0x0) {
      local_10 = 2;
      sVar4 = 0;
      goto LAB_0015347f;
    }
  }
  ASN_DEBUG("Decoding %s as INTEGER (tm=%d)",*in_RSI,(ulong)in_R9D);
  aVar3 = ber_check_tags((asn_codec_ctx_t *)l,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                         unaff_retaddr,iVar2,in_stack_00000040,in_stack_00000048,(int *)length);
  sVar4 = aVar3.consumed;
  local_10 = (ulong)aVar3.code;
  if (aVar3.code == RC_OK) {
    ASN_DEBUG("%s length is %d bytes",*in_RSI,local_58 & 0xffffffff);
    if ((long)(in_R8 - sVar4) < (long)local_58) {
      local_10 = 1;
      sVar4 = 0;
    }
    else {
      if ((lVar1 == 0) || (*(int *)(lVar1 + 0x20) == 0)) {
        iVar2 = asn_INTEGER2long((INTEGER_t *)(in_RCX + sVar4),(long *)(in_RCX + sVar4));
      }
      else {
        iVar2 = asn_INTEGER2ulong(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      if (iVar2 == 0) {
        *local_50 = in_stack_ffffffffffffff78;
        local_10 = 0;
        sVar4 = local_58 + sVar4;
        ASN_DEBUG("Took %ld/%ld bytes to encode %s (%ld)",sVar4,local_58,*in_RSI,*local_50);
      }
      else {
        local_10 = 2;
        sVar4 = 0;
      }
    }
  }
LAB_0015347f:
  aVar3.consumed = sVar4;
  aVar3._0_8_ = local_10;
  return aVar3;
}

Assistant:

asn_dec_rval_t
NativeInteger_decode_ber(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td,
	void **nint_ptr, const void *buf_ptr, size_t size, int tag_mode) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	long *native = (long *)*nint_ptr;
	asn_dec_rval_t rval;
	ber_tlv_len_t length;

	/*
	 * If the structure is not there, allocate it.
	 */
	if(native == NULL) {
		native = (long *)(*nint_ptr = CALLOC(1, sizeof(*native)));
		if(native == NULL) {
			rval.code = RC_FAIL;
			rval.consumed = 0;
			return rval;
		}
	}

	ASN_DEBUG("Decoding %s as INTEGER (tm=%d)",
		td->name, tag_mode);

	/*
	 * Check tags.
	 */
	rval = ber_check_tags(opt_codec_ctx, td, 0, buf_ptr, size,
			tag_mode, 0, &length, 0);
	if(rval.code != RC_OK)
		return rval;

	ASN_DEBUG("%s length is %d bytes", td->name, (int)length);

	/*
	 * Make sure we have this length.
	 */
	buf_ptr = ((const char *)buf_ptr) + rval.consumed;
	size -= rval.consumed;
	if(length > (ber_tlv_len_t)size) {
		rval.code = RC_WMORE;
		rval.consumed = 0;
		return rval;
	}

	/*
	 * ASN.1 encoded INTEGER: buf_ptr, length
	 * Fill the native, at the same time checking for overflow.
	 * If overflow occured, return with RC_FAIL.
	 */
	{
		INTEGER_t tmp;
		union {
			const void *constbuf;
			void *nonconstbuf;
		} unconst_buf;
		long l;

		unconst_buf.constbuf = buf_ptr;
		tmp.buf = (uint8_t *)unconst_buf.nonconstbuf;
		tmp.size = length;

		if((specs&&specs->field_unsigned)
			? asn_INTEGER2ulong(&tmp, (unsigned long *)&l) /* sic */
			: asn_INTEGER2long(&tmp, &l)) {
			rval.code = RC_FAIL;
			rval.consumed = 0;
			return rval;
		}

		*native = l;
	}

	rval.code = RC_OK;
	rval.consumed += length;

	ASN_DEBUG("Took %ld/%ld bytes to encode %s (%ld)",
		(long)rval.consumed, (long)length, td->name, (long)*native);

	return rval;
}